

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::pickPasses(TranslateToFuzzReader *this,OptimizationOptions *options)

{
  bool bVar1;
  Index IVar2;
  size_type sVar3;
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  *pvVar4;
  byte local_1279;
  PassInfo local_1260;
  PassInfo local_1208;
  PassInfo local_11b0;
  PassInfo local_1158;
  PassInfo local_1100;
  PassInfo local_10a8;
  PassInfo local_1050;
  PassInfo local_ff8;
  PassInfo local_fa0;
  PassInfo local_f48;
  PassInfo local_ef0;
  PassInfo local_e98;
  PassInfo local_e40;
  PassInfo local_de8;
  PassInfo local_d90;
  PassInfo local_d38;
  PassInfo local_ce0;
  PassInfo local_c88;
  PassInfo local_c30;
  PassInfo local_bd8;
  PassInfo local_b80;
  PassInfo local_b28;
  PassInfo local_ad0;
  PassInfo local_a78;
  PassInfo local_a20;
  PassInfo local_9c8;
  PassInfo local_970;
  PassInfo local_918;
  PassInfo local_8c0;
  PassInfo local_868;
  PassInfo local_810;
  PassInfo local_7b8;
  PassInfo local_760;
  PassInfo local_708;
  PassInfo local_6b0;
  PassInfo local_658;
  PassInfo local_600;
  PassInfo local_5a8;
  PassInfo local_550;
  PassInfo local_4f8;
  PassInfo local_4a0;
  PassInfo local_448;
  PassInfo local_3f0;
  PassInfo local_398;
  PassInfo local_340;
  PassInfo local_2e8;
  PassInfo local_290;
  PassInfo local_238;
  PassInfo local_1e0;
  PassInfo local_188;
  PassInfo local_130;
  PassInfo local_d8;
  PassInfo local_70;
  OptimizationOptions *local_18;
  OptimizationOptions *options_local;
  TranslateToFuzzReader *this_local;
  
  local_18 = options;
  options_local = (OptimizationOptions *)this;
  bVar1 = oneIn(this,2);
  if (bVar1) {
    pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
              *)(local_18 + 0x188);
    OptimizationOptions::PassInfo::PassInfo(&local_70,"enclose-world");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::push_back(pvVar4,&local_70);
    OptimizationOptions::PassInfo::~PassInfo(&local_70);
  }
  while( true ) {
    sVar3 = std::
            vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
            ::size((vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188));
    local_1279 = 0;
    if (sVar3 < 0x14) {
      bVar1 = Random::finished(&this->random);
      local_1279 = 0;
      if (!bVar1) {
        bVar1 = oneIn(this,3);
        local_1279 = bVar1 ^ 0xff;
      }
    }
    if ((local_1279 & 1) == 0) break;
    IVar2 = upTo(this,0x2a);
    switch(IVar2) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 4:
      IVar2 = upTo(this,4);
      *(Index *)(local_18 + 0xbc) = IVar2;
      IVar2 = upTo(this,3);
      *(Index *)(local_18 + 0xc0) = IVar2;
      OptimizationOptions::addDefaultOptPasses(local_18);
      break;
    case 5:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_d8,"coalesce-locals");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_d8);
      OptimizationOptions::PassInfo::~PassInfo(&local_d8);
      break;
    case 6:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_130,"code-pushing");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_130);
      OptimizationOptions::PassInfo::~PassInfo(&local_130);
      break;
    case 7:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_188,"code-folding");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_188);
      OptimizationOptions::PassInfo::~PassInfo(&local_188);
      break;
    case 8:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_1e0,"dce");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_1e0);
      OptimizationOptions::PassInfo::~PassInfo(&local_1e0);
      break;
    case 9:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_238,"duplicate-function-elimination");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_238);
      OptimizationOptions::PassInfo::~PassInfo(&local_238);
      break;
    case 10:
      bVar1 = FeatureSet::hasReferenceTypes((FeatureSet *)(this->wasm + 0x178));
      if (((!bVar1) &&
          (bVar1 = FeatureSet::hasExceptionHandling((FeatureSet *)(this->wasm + 0x178)), !bVar1)) &&
         (bVar1 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x178)), !bVar1)) {
        pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                  *)(local_18 + 0x188);
        OptimizationOptions::PassInfo::PassInfo(&local_290,"flatten");
        std::
        vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
        ::push_back(pvVar4,&local_290);
        OptimizationOptions::PassInfo::~PassInfo(&local_290);
        bVar1 = oneIn(this,2);
        if (bVar1) {
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_2e8,"rereloop");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_2e8);
          OptimizationOptions::PassInfo::~PassInfo(&local_2e8);
        }
      }
      break;
    case 0xb:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_340,"inlining");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_340);
      OptimizationOptions::PassInfo::~PassInfo(&local_340);
      break;
    case 0xc:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_398,"inlining-optimizing");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_398);
      OptimizationOptions::PassInfo::~PassInfo(&local_398);
      break;
    case 0xd:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_3f0,"local-cse");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_3f0);
      OptimizationOptions::PassInfo::~PassInfo(&local_3f0);
      break;
    case 0xe:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_448,"memory-packing");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_448);
      OptimizationOptions::PassInfo::~PassInfo(&local_448);
      break;
    case 0xf:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_4a0,"merge-blocks");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_4a0);
      OptimizationOptions::PassInfo::~PassInfo(&local_4a0);
      break;
    case 0x10:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_4f8,"optimize-instructions");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_4f8);
      OptimizationOptions::PassInfo::~PassInfo(&local_4f8);
      break;
    case 0x11:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_550,"pick-load-signs");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_550);
      OptimizationOptions::PassInfo::~PassInfo(&local_550);
      break;
    case 0x12:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_5a8,"precompute");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_5a8);
      OptimizationOptions::PassInfo::~PassInfo(&local_5a8);
      break;
    case 0x13:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_600,"precompute-propagate");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_600);
      OptimizationOptions::PassInfo::~PassInfo(&local_600);
      break;
    case 0x14:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_658,"remove-unused-brs");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_658);
      OptimizationOptions::PassInfo::~PassInfo(&local_658);
      break;
    case 0x15:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_6b0,"remove-unused-module-elements");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_6b0);
      OptimizationOptions::PassInfo::~PassInfo(&local_6b0);
      break;
    case 0x16:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_708,"remove-unused-names");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_708);
      OptimizationOptions::PassInfo::~PassInfo(&local_708);
      break;
    case 0x17:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_760,"reorder-functions");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_760);
      OptimizationOptions::PassInfo::~PassInfo(&local_760);
      break;
    case 0x18:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_7b8,"reorder-locals");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_7b8);
      OptimizationOptions::PassInfo::~PassInfo(&local_7b8);
      break;
    case 0x19:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_810,"directize");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_810);
      OptimizationOptions::PassInfo::~PassInfo(&local_810);
      break;
    case 0x1a:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_868,"simplify-locals");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_868);
      OptimizationOptions::PassInfo::~PassInfo(&local_868);
      break;
    case 0x1b:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_8c0,"simplify-locals-notee");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_8c0);
      OptimizationOptions::PassInfo::~PassInfo(&local_8c0);
      break;
    case 0x1c:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_918,"simplify-locals-nostructure");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_918);
      OptimizationOptions::PassInfo::~PassInfo(&local_918);
      break;
    case 0x1d:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_970,"simplify-locals-notee-nostructure");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_970);
      OptimizationOptions::PassInfo::~PassInfo(&local_970);
      break;
    case 0x1e:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_9c8,"ssa");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_9c8);
      OptimizationOptions::PassInfo::~PassInfo(&local_9c8);
      break;
    case 0x1f:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_a20,"vacuum");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_a20);
      OptimizationOptions::PassInfo::~PassInfo(&local_a20);
      break;
    case 0x20:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_a78,"merge-locals");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_a78);
      OptimizationOptions::PassInfo::~PassInfo(&local_a78);
      break;
    case 0x21:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_ad0,"licm");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_ad0);
      OptimizationOptions::PassInfo::~PassInfo(&local_ad0);
      break;
    case 0x22:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_b28,"tuple-optimization");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_b28);
      OptimizationOptions::PassInfo::~PassInfo(&local_b28);
      break;
    case 0x23:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_b80,"rse");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_b80);
      OptimizationOptions::PassInfo::~PassInfo(&local_b80);
      break;
    case 0x24:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_bd8,"monomorphize");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_bd8);
      OptimizationOptions::PassInfo::~PassInfo(&local_bd8);
      break;
    case 0x25:
      pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                *)(local_18 + 0x188);
      OptimizationOptions::PassInfo::PassInfo(&local_c30,"monomorphize-always");
      std::
      vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
      ::push_back(pvVar4,&local_c30);
      OptimizationOptions::PassInfo::~PassInfo(&local_c30);
      break;
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
      bVar1 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x178));
      if (bVar1) {
        local_18[0xdd] = (OptimizationOptions)0x1;
        this->closedWorld = true;
        IVar2 = upTo(this,0x10);
        switch(IVar2) {
        case 0:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_c88,"abstract-type-refining");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_c88);
          OptimizationOptions::PassInfo::~PassInfo(&local_c88);
          break;
        case 1:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_ce0,"cfp");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_ce0);
          OptimizationOptions::PassInfo::~PassInfo(&local_ce0);
          break;
        case 2:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_d38,"gsi");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_d38);
          OptimizationOptions::PassInfo::~PassInfo(&local_d38);
          break;
        case 3:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_d90,"gto");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_d90);
          OptimizationOptions::PassInfo::~PassInfo(&local_d90);
          break;
        case 4:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_de8,"heap2local");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_de8);
          OptimizationOptions::PassInfo::~PassInfo(&local_de8);
          break;
        case 5:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_e40,"heap-store-optimization");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_e40);
          OptimizationOptions::PassInfo::~PassInfo(&local_e40);
          break;
        case 6:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_e98,"minimize-rec-groups");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_e98);
          OptimizationOptions::PassInfo::~PassInfo(&local_e98);
          break;
        case 7:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_ef0,"remove-unused-types");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_ef0);
          OptimizationOptions::PassInfo::~PassInfo(&local_ef0);
          break;
        case 8:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_f48,"signature-pruning");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_f48);
          OptimizationOptions::PassInfo::~PassInfo(&local_f48);
          break;
        case 9:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_fa0,"signature-refining");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_fa0);
          OptimizationOptions::PassInfo::~PassInfo(&local_fa0);
          break;
        case 10:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_ff8,"type-finalizing");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_ff8);
          OptimizationOptions::PassInfo::~PassInfo(&local_ff8);
          break;
        case 0xb:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_1050,"type-refining");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_1050);
          OptimizationOptions::PassInfo::~PassInfo(&local_1050);
          break;
        case 0xc:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_10a8,"type-merging");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_10a8);
          OptimizationOptions::PassInfo::~PassInfo(&local_10a8);
          break;
        case 0xd:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_1100,"type-ssa");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_1100);
          OptimizationOptions::PassInfo::~PassInfo(&local_1100);
          break;
        case 0xe:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_1158,"type-unfinalizing");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_1158);
          OptimizationOptions::PassInfo::~PassInfo(&local_1158);
          break;
        case 0xf:
          pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
                    *)(local_18 + 0x188);
          OptimizationOptions::PassInfo::PassInfo(&local_11b0,"unsubtyping");
          std::
          vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
          ::push_back(pvVar4,&local_11b0);
          OptimizationOptions::PassInfo::~PassInfo(&local_11b0);
          break;
        default:
          wasm::handle_unreachable
                    ("unexpected value",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,299);
        }
      }
      break;
    default:
      wasm::handle_unreachable
                ("unexpected value",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                 ,0x130);
    }
  }
  bVar1 = oneIn(this,2);
  if (bVar1) {
    IVar2 = upTo(this,4);
    *(Index *)(local_18 + 0xbc) = IVar2;
    IVar2 = upTo(this,3);
    *(Index *)(local_18 + 0xc0) = IVar2;
  }
  if ((((byte)local_18[0xdd] & 1) == 0) && (bVar1 = oneIn(this,2), bVar1)) {
    local_18[0xdd] = (OptimizationOptions)0x1;
  }
  bVar1 = oneIn(this,2);
  if (bVar1) {
    pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
              *)(local_18 + 0x188);
    OptimizationOptions::PassInfo::PassInfo(&local_1208,"legalize-and-prune-js-interface");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::push_back(pvVar4,&local_1208);
    OptimizationOptions::PassInfo::~PassInfo(&local_1208);
  }
  bVar1 = FeatureSet::hasGC((FeatureSet *)(this->wasm + 0x178));
  if ((bVar1) && (bVar1 = oneIn(this,10), !bVar1)) {
    pvVar4 = (vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
              *)(local_18 + 0x188);
    OptimizationOptions::PassInfo::PassInfo(&local_1260,"dce");
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::push_back(pvVar4,&local_1260);
    OptimizationOptions::PassInfo::~PassInfo(&local_1260);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::pickPasses(OptimizationOptions& options) {
  // Pick random passes to further shape the wasm. This is similar to how we
  // pick random passes in fuzz_opt.py, but the goal there is to find problems
  // in the passes, while the goal here is more to shape the wasm, so that
  // translate-to-fuzz emits interesting outputs (the latter is important for
  // things like ClusterFuzz, where we are using Binaryen to fuzz other things
  // than itself). As a result, the list of passes here is different from
  // fuzz_opt.py.

  // Enclose the world, some of the time. We do this before picking any other
  // passes so that we make the initial fuzz contents more optimizable by
  // closed-world passes later. Note that we do this regardless of whether we
  // are in closed-world mode or not, as it is good to get this variety
  // regardless.
  if (oneIn(2)) {
    options.passes.push_back("enclose-world");
  }

  // Main selection of passes.
  while (options.passes.size() < 20 && !random.finished() && !oneIn(3)) {
    switch (upTo(42)) {
      case 0:
      case 1:
      case 2:
      case 3:
      case 4: {
        options.passOptions.optimizeLevel = upTo(4);
        options.passOptions.shrinkLevel = upTo(3);
        options.addDefaultOptPasses();
        break;
      }
      case 5:
        options.passes.push_back("coalesce-locals");
        break;
      case 6:
        options.passes.push_back("code-pushing");
        break;
      case 7:
        options.passes.push_back("code-folding");
        break;
      case 8:
        options.passes.push_back("dce");
        break;
      case 9:
        options.passes.push_back("duplicate-function-elimination");
        break;
      case 10:
        // Some features do not support flatten yet.
        if (!wasm.features.hasReferenceTypes() &&
            !wasm.features.hasExceptionHandling() && !wasm.features.hasGC()) {
          options.passes.push_back("flatten");
          if (oneIn(2)) {
            options.passes.push_back("rereloop");
          }
        }
        break;
      case 11:
        options.passes.push_back("inlining");
        break;
      case 12:
        options.passes.push_back("inlining-optimizing");
        break;
      case 13:
        options.passes.push_back("local-cse");
        break;
      case 14:
        options.passes.push_back("memory-packing");
        break;
      case 15:
        options.passes.push_back("merge-blocks");
        break;
      case 16:
        options.passes.push_back("optimize-instructions");
        break;
      case 17:
        options.passes.push_back("pick-load-signs");
        break;
      case 18:
        options.passes.push_back("precompute");
        break;
      case 19:
        options.passes.push_back("precompute-propagate");
        break;
      case 20:
        options.passes.push_back("remove-unused-brs");
        break;
      case 21:
        options.passes.push_back("remove-unused-module-elements");
        break;
      case 22:
        options.passes.push_back("remove-unused-names");
        break;
      case 23:
        options.passes.push_back("reorder-functions");
        break;
      case 24:
        options.passes.push_back("reorder-locals");
        break;
      case 25:
        options.passes.push_back("directize");
        break;
      case 26:
        options.passes.push_back("simplify-locals");
        break;
      case 27:
        options.passes.push_back("simplify-locals-notee");
        break;
      case 28:
        options.passes.push_back("simplify-locals-nostructure");
        break;
      case 29:
        options.passes.push_back("simplify-locals-notee-nostructure");
        break;
      case 30:
        options.passes.push_back("ssa");
        break;
      case 31:
        options.passes.push_back("vacuum");
        break;
      case 32:
        options.passes.push_back("merge-locals");
        break;
      case 33:
        options.passes.push_back("licm");
        break;
      case 34:
        options.passes.push_back("tuple-optimization");
        break;
      case 35:
        options.passes.push_back("rse");
        break;
      case 36:
        options.passes.push_back("monomorphize");
        break;
      case 37:
        options.passes.push_back("monomorphize-always");
        break;
      case 38:
      case 39:
      case 40:
      case 41:
        // GC specific passes.
        if (wasm.features.hasGC()) {
          // Most of these depend on closed world, so just set that. Set it both
          // on the global pass options, and in the internal state of this
          // TranslateToFuzzReader instance.
          options.passOptions.closedWorld = true;
          closedWorld = true;

          switch (upTo(16)) {
            case 0:
              options.passes.push_back("abstract-type-refining");
              break;
            case 1:
              options.passes.push_back("cfp");
              break;
            case 2:
              options.passes.push_back("gsi");
              break;
            case 3:
              options.passes.push_back("gto");
              break;
            case 4:
              options.passes.push_back("heap2local");
              break;
            case 5:
              options.passes.push_back("heap-store-optimization");
              break;
            case 6:
              options.passes.push_back("minimize-rec-groups");
              break;
            case 7:
              options.passes.push_back("remove-unused-types");
              break;
            case 8:
              options.passes.push_back("signature-pruning");
              break;
            case 9:
              options.passes.push_back("signature-refining");
              break;
            case 10:
              options.passes.push_back("type-finalizing");
              break;
            case 11:
              options.passes.push_back("type-refining");
              break;
            case 12:
              options.passes.push_back("type-merging");
              break;
            case 13:
              options.passes.push_back("type-ssa");
              break;
            case 14:
              options.passes.push_back("type-unfinalizing");
              break;
            case 15:
              options.passes.push_back("unsubtyping");
              break;
            default:
              WASM_UNREACHABLE("unexpected value");
          }
        }
        break;
      default:
        WASM_UNREACHABLE("unexpected value");
    }
  }

  if (oneIn(2)) {
    // We randomize these when we pick -O?, but sometimes do so even without, as
    // they affect some passes.
    options.passOptions.optimizeLevel = upTo(4);
    options.passOptions.shrinkLevel = upTo(3);
  }

  if (!options.passOptions.closedWorld && oneIn(2)) {
    options.passOptions.closedWorld = true;
  }

  // Prune things that error in JS if we call them (like SIMD), some of the
  // time. This alters the wasm/JS boundary quite a lot, so testing both forms
  // is useful.
  if (oneIn(2)) {
    options.passes.push_back("legalize-and-prune-js-interface");
  }

  // Usually DCE at the very end, to ensure that our binaries validate in other
  // VMs, due to how non-nullable local validation and unreachable code
  // interact. See fuzz_opt.py and
  //   https://github.com/WebAssembly/binaryen/pull/5665
  //   https://github.com/WebAssembly/binaryen/issues/5599
  if (wasm.features.hasGC() && !oneIn(10)) {
    options.passes.push_back("dce");
  }

  // TODO: We could in theory run some function-level passes on particular
  //       functions, but then we'd need to do this after generation, not
  //       before (and random data no longer remains then).
}